

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::CheckElem<int,int>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,int *matcher)

{
  EqMatcher<int> local_48;
  AssertionResult local_38;
  
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_00224340;
  local_48.m_expected = matcher;
  EqMatcher<int>::operator()(&local_38,&local_48,actual);
  std::__cxx11::string::~string((string *)&local_38);
  return local_38.m_result;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }